

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::PushColormap(ImPlotColormap colormap)

{
  int iVar1;
  int *__src;
  ImPlotContext *pIVar2;
  int *__dest;
  int iVar3;
  int iVar4;
  
  pIVar2 = GImPlot;
  if ((-1 < colormap) && (colormap < (GImPlot->ColormapData).Count)) {
    iVar4 = (GImPlot->ColormapModifiers).Size;
    iVar1 = (GImPlot->ColormapModifiers).Capacity;
    if (iVar4 == iVar1) {
      iVar4 = iVar4 + 1;
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar1 < iVar4) {
        __dest = (int *)ImGui::MemAlloc((long)iVar4 << 2);
        __src = (pIVar2->ColormapModifiers).Data;
        if (__src != (int *)0x0) {
          memcpy(__dest,__src,(long)(pIVar2->ColormapModifiers).Size << 2);
          ImGui::MemFree((pIVar2->ColormapModifiers).Data);
        }
        (pIVar2->ColormapModifiers).Data = __dest;
        (pIVar2->ColormapModifiers).Capacity = iVar4;
      }
    }
    (pIVar2->ColormapModifiers).Data[(pIVar2->ColormapModifiers).Size] = (pIVar2->Style).Colormap;
    (pIVar2->ColormapModifiers).Size = (pIVar2->ColormapModifiers).Size + 1;
    (pIVar2->Style).Colormap = colormap;
    return;
  }
  __assert_fail("(colormap >= 0 && colormap < gp.ColormapData.Count) && \"The colormap index is invalid!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xd18,"void ImPlot::PushColormap(ImPlotColormap)");
}

Assistant:

void PushColormap(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(colormap >= 0 && colormap < gp.ColormapData.Count, "The colormap index is invalid!");
    gp.ColormapModifiers.push_back(gp.Style.Colormap);
    gp.Style.Colormap = colormap;
}